

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkAllocationCallbackUtil.cpp
# Opt level: O1

ostream * vk::operator<<(ostream *str,AllocationCallbackViolation *violation)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  Hex<16UL> local_20;
  
  poVar1 = str;
  switch(violation->reason) {
  case REASON_DOUBLE_FREE:
    std::__ostream_insert<char,std::char_traits<char>>(str,"Double free of ",0xf);
    local_20.value = (violation->record).data.allocation.size;
    tcu::Format::Hex<16UL>::toStream(&local_20,str);
    return str;
  case REASON_FREE_NOT_ALLOCATED_PTR:
    pcVar3 = "Attempt to free ";
    lVar2 = 0x10;
    goto LAB_00a0e853;
  case REASON_REALLOC_NOT_ALLOCATED_PTR:
    pcVar3 = "Attempt to reallocate ";
    lVar2 = 0x16;
LAB_00a0e853:
    std::__ostream_insert<char,std::char_traits<char>>(str,pcVar3,lVar2);
    local_20.value = (violation->record).data.allocation.size;
    poVar1 = tcu::Format::Hex<16UL>::toStream(&local_20,str);
    pcVar3 = " which has not been allocated";
    lVar2 = 0x1d;
    break;
  case REASON_REALLOC_FREED_PTR:
    std::__ostream_insert<char,std::char_traits<char>>(str,"Attempt to reallocate ",0x16);
    local_20.value = (violation->record).data.allocation.size;
    poVar1 = tcu::Format::Hex<16UL>::toStream(&local_20,str);
    pcVar3 = " which has been freed";
    lVar2 = 0x15;
    break;
  case REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL:
    std::__ostream_insert<char,std::char_traits<char>>(str,"Internal allocation total for (",0x1f);
    poVar1 = (ostream *)
             std::ostream::operator<<(str,(violation->record).data.internalAllocation.type);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(violation->record).data.internalAllocation.scope);
    pcVar3 = ") is negative";
    lVar2 = 0xd;
    break;
  case REASON_INVALID_ALLOCATION_SCOPE:
    pcVar3 = "Invalid allocation scope";
    lVar2 = 0x18;
    break;
  case REASON_INVALID_INTERNAL_ALLOCATION_TYPE:
    std::__ostream_insert<char,std::char_traits<char>>(str,"Invalid internal allocation type ",0x21)
    ;
    local_20.value = (deUint64)(violation->record).data.internalAllocation.type;
    tcu::Format::Hex<8UL>::toStream((Hex<8UL> *)&local_20,str);
    return str;
  case REASON_INVALID_ALIGNMENT:
    pcVar3 = "Invalid alignment";
    lVar2 = 0x11;
    break;
  case REASON_REALLOC_DIFFERENT_ALIGNMENT:
    pcVar3 = "Reallocation with different alignment";
    lVar2 = 0x25;
    break;
  default:
    goto switchD_00a0e772_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
switchD_00a0e772_default:
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const AllocationCallbackViolation& violation)
{
	switch (violation.reason)
	{
		case AllocationCallbackViolation::REASON_DOUBLE_FREE:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_FREE);
			str << "Double free of " << tcu::toHex(violation.record.data.free.mem);
			break;
		}

		case AllocationCallbackViolation::REASON_FREE_NOT_ALLOCATED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_FREE);
			str << "Attempt to free " << tcu::toHex(violation.record.data.free.mem) << " which has not been allocated";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_NOT_ALLOCATED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_REALLOCATION);
			str << "Attempt to reallocate " << tcu::toHex(violation.record.data.reallocation.original) << " which has not been allocated";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_FREED_PTR:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_REALLOCATION);
			str << "Attempt to reallocate " << tcu::toHex(violation.record.data.reallocation.original) << " which has been freed";
			break;
		}

		case AllocationCallbackViolation::REASON_NEGATIVE_INTERNAL_ALLOCATION_TOTAL:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE);
			str << "Internal allocation total for (" << violation.record.data.internalAllocation.type << ", " << violation.record.data.internalAllocation.scope << ") is negative";
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_INTERNAL_ALLOCATION_TYPE:
		{
			DE_ASSERT(violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_ALLOCATION ||
					  violation.record.type == AllocationCallbackRecord::TYPE_INTERNAL_FREE);
			str << "Invalid internal allocation type " << tcu::toHex(violation.record.data.internalAllocation.type);
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_ALLOCATION_SCOPE:
		{
			str << "Invalid allocation scope";
			break;
		}

		case AllocationCallbackViolation::REASON_INVALID_ALIGNMENT:
		{
			str << "Invalid alignment";
			break;
		}

		case AllocationCallbackViolation::REASON_REALLOC_DIFFERENT_ALIGNMENT:
		{
			str << "Reallocation with different alignment";
			break;
		}

		default:
			DE_ASSERT(false);
	}

	return str;
}